

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  u8 *puVar1;
  ushort uVar2;
  int iVar3;
  u8 *puVar4;
  ulong uVar5;
  
  if (*pRC != 0) {
    return;
  }
  puVar4 = pPage->aCellIdx;
  uVar2 = *(ushort *)(puVar4 + (long)idx * 2);
  uVar2 = uVar2 << 8 | uVar2 >> 8;
  puVar1 = pPage->aData;
  uVar5 = (ulong)pPage->hdrOffset;
  if ((uVar2 < (ushort)(*(ushort *)(puVar1 + uVar5 + 5) << 8 | *(ushort *)(puVar1 + uVar5 + 5) >> 8)
      ) || (pPage->pBt->usableSize < (uint)uVar2 + sz)) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x101a5,
                "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
    *pRC = 0xb;
  }
  else {
    iVar3 = freeSpace(pPage,uVar2,(u16)sz);
    if (iVar3 == 0) {
      uVar2 = pPage->nCell - 1;
      pPage->nCell = uVar2;
      if (uVar2 == 0) {
        puVar4 = puVar1 + uVar5 + 1;
        puVar4[0] = '\0';
        puVar4[1] = '\0';
        puVar4[2] = '\0';
        puVar4[3] = '\0';
        puVar1[uVar5 + 7] = '\0';
        puVar1[uVar5 + 5] = *(u8 *)((long)&pPage->pBt->usableSize + 1);
        puVar1[uVar5 + 6] = (u8)pPage->pBt->usableSize;
        pPage->nFree = ((short)pPage->pBt->usableSize -
                       ((ushort)pPage->childPtrSize + (ushort)pPage->hdrOffset)) - 8;
      }
      else {
        puVar4 = puVar4 + (long)idx * 2;
        memmove(puVar4,puVar4 + 2,(long)(int)(((uint)uVar2 - idx) * 2));
        puVar1[uVar5 + 3] = *(u8 *)((long)&pPage->nCell + 1);
        puVar1[uVar5 + 4] = (u8)pPage->nCell;
        pPage->nFree = pPage->nFree + 2;
      }
    }
    else {
      *pRC = iVar3;
    }
  }
  return;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;
  assert( idx>=0 && idx<pPage->nCell );
  assert( CORRUPT_DB || sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc < (u32)get2byte(&data[hdr+5]) || pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  pPage->nCell--;
  if( pPage->nCell==0 ){
    memset(&data[hdr+1], 0, 4);
    data[hdr+7] = 0;
    put2byte(&data[hdr+5], pPage->pBt->usableSize);
    pPage->nFree = pPage->pBt->usableSize - pPage->hdrOffset
                       - pPage->childPtrSize - 8;
  }else{
    memmove(ptr, ptr+2, 2*(pPage->nCell - idx));
    put2byte(&data[hdr+3], pPage->nCell);
    pPage->nFree += 2;
  }
}